

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::StringUtil::StringToByte
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *hex_str)

{
  uchar *bytes_out;
  CfdException *this;
  allocator local_4d;
  int ret;
  size_t buf_size;
  undefined1 local_40 [32];
  
  if (hex_str->_M_string_length == 0) {
    local_40._0_8_ = "cfdcore_util.cpp";
    local_40._8_4_ = 0x4cd;
    local_40._16_8_ = "StringToByte";
    logger::info<>((CfdSourceLocation *)local_40,"hex_str empty. return empty buffer.");
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,hex_str->_M_string_length + 1,(allocator_type *)local_40);
    buf_size = 0;
    bytes_out = (__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
    ret = wally_hex_to_bytes((hex_str->_M_dataplus)._M_p,bytes_out,
                             (long)(__return_storage_ptr__->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)bytes_out,
                             &buf_size);
    if (ret != 0) {
      local_40._0_8_ = "cfdcore_util.cpp";
      local_40._8_4_ = 0x4d7;
      local_40._16_8_ = "StringToByte";
      logger::warn<int&>((CfdSourceLocation *)local_40,"wally_hex_to_bytes NG[{}].",&ret);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_40,"hex to byte convert error.",&local_4d);
      CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,buf_size);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringUtil::StringToByte(const std::string &hex_str) {
  if (hex_str.empty()) {
    info(CFD_LOG_SOURCE, "hex_str empty. return empty buffer.");
    return std::vector<uint8_t>();
  }
  std::vector<uint8_t> buffer(hex_str.size() + 1);
  size_t buf_size = 0;
  int ret = wally_hex_to_bytes(
      hex_str.data(), buffer.data(), buffer.size(), &buf_size);
  if (ret == WALLY_OK) {
    buffer.resize(buf_size);
  } else {
    warn(CFD_LOG_SOURCE, "wally_hex_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalArgumentError, "hex to byte convert error.");
  }

  return buffer;
}